

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle-vulkan.c
# Opt level: O0

void demo_prepare_vertices(demo *demo)

{
  void *local_d8;
  void *data;
  undefined1 auStack_c8 [3];
  _Bool pass;
  VkResult err;
  VkMemoryRequirements mem_reqs;
  VkMemoryAllocateInfo mem_alloc;
  VkBufferCreateInfo buf_info;
  float vb [3] [5];
  demo *demo_local;
  
  memcpy(&buf_info.pQueueFamilyIndices,&DAT_0012ff70,0x3c);
  memset(&mem_alloc.memoryTypeIndex,0,0x38);
  mem_alloc.memoryTypeIndex = 0xc;
  buf_info.flags = 0x3c;
  buf_info._20_4_ = 0;
  buf_info.size._0_4_ = 0x80;
  mem_reqs.memoryTypeBits = 5;
  mem_reqs._20_4_ = 0;
  mem_alloc.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  mem_alloc._4_4_ = 0;
  mem_alloc.pNext = (void *)0x0;
  mem_alloc.allocationSize = 0;
  memset(&demo->vertices,0,0x70);
  data._4_4_ = (*glad_vkCreateBuffer)
                         (demo->device,(VkBufferCreateInfo *)&mem_alloc.memoryTypeIndex,
                          (VkAllocationCallbacks *)0x0,&(demo->vertices).buf);
  if (data._4_4_ != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,0x423,"void demo_prepare_vertices(struct demo *)");
  }
  (*glad_vkGetBufferMemoryRequirements)
            (demo->device,(demo->vertices).buf,(VkMemoryRequirements *)auStack_c8);
  if (data._4_4_ != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,0x426,"void demo_prepare_vertices(struct demo *)");
  }
  mem_alloc.pNext = _auStack_c8;
  data._3_1_ = memory_type_from_properties
                         (demo,(uint32_t)mem_reqs.alignment,6,(uint32_t *)&mem_alloc.allocationSize)
  ;
  if (!(bool)data._3_1_) {
    __assert_fail("pass",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,0x42d,"void demo_prepare_vertices(struct demo *)");
  }
  data._4_4_ = (*glad_vkAllocateMemory)
                         (demo->device,(VkMemoryAllocateInfo *)&mem_reqs.memoryTypeBits,
                          (VkAllocationCallbacks *)0x0,&(demo->vertices).mem);
  if (data._4_4_ == VK_SUCCESS) {
    data._4_4_ = (*glad_vkMapMemory)(demo->device,(demo->vertices).mem,0,
                                     (VkDeviceSize)mem_alloc.pNext,0,&local_d8);
    if (data._4_4_ != VK_SUCCESS) {
      __assert_fail("!err",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                    ,0x434,"void demo_prepare_vertices(struct demo *)");
    }
    memcpy(local_d8,&buf_info.pQueueFamilyIndices,0x3c);
    (*glad_vkUnmapMemory)(demo->device,(demo->vertices).mem);
    data._4_4_ = (*glad_vkBindBufferMemory)
                           (demo->device,(demo->vertices).buf,(demo->vertices).mem,0);
    if (data._4_4_ == VK_SUCCESS) {
      (demo->vertices).vi.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
      (demo->vertices).vi.pNext = (void *)0x0;
      (demo->vertices).vi.vertexBindingDescriptionCount = 1;
      (demo->vertices).vi.pVertexBindingDescriptions = (demo->vertices).vi_bindings;
      (demo->vertices).vi.vertexAttributeDescriptionCount = 2;
      (demo->vertices).vi.pVertexAttributeDescriptions = (demo->vertices).vi_attrs;
      (demo->vertices).vi_bindings[0].binding = 0;
      (demo->vertices).vi_bindings[0].stride = 0x14;
      (demo->vertices).vi_bindings[0].inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
      (demo->vertices).vi_attrs[0].binding = 0;
      (demo->vertices).vi_attrs[0].location = 0;
      (demo->vertices).vi_attrs[0].format = VK_FORMAT_R32G32B32_SFLOAT;
      (demo->vertices).vi_attrs[0].offset = 0;
      (demo->vertices).vi_attrs[1].binding = 0;
      (demo->vertices).vi_attrs[1].location = 1;
      (demo->vertices).vi_attrs[1].format = VK_FORMAT_R32G32_SFLOAT;
      (demo->vertices).vi_attrs[1].offset = 0xc;
      return;
    }
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,0x43c,"void demo_prepare_vertices(struct demo *)");
  }
  __assert_fail("!err",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                ,0x430,"void demo_prepare_vertices(struct demo *)");
}

Assistant:

static void demo_prepare_vertices(struct demo *demo) {
    // clang-format off
    const float vb[3][5] = {
        /*      position             texcoord */
        { -1.0f, -1.0f,  0.25f,     0.0f, 0.0f },
        {  1.0f, -1.0f,  0.25f,     1.0f, 0.0f },
        {  0.0f,  1.0f,  1.0f,      0.5f, 1.0f },
    };
    // clang-format on
    const VkBufferCreateInfo buf_info = {
        .sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,
        .pNext = NULL,
        .size = sizeof(vb),
        .usage = VK_BUFFER_USAGE_VERTEX_BUFFER_BIT,
        .flags = 0,
    };
    VkMemoryAllocateInfo mem_alloc = {
        .sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,
        .pNext = NULL,
        .allocationSize = 0,
        .memoryTypeIndex = 0,
    };
    VkMemoryRequirements mem_reqs;
    VkResult U_ASSERT_ONLY err;
    bool U_ASSERT_ONLY pass;
    void *data;

    memset(&demo->vertices, 0, sizeof(demo->vertices));

    err = vkCreateBuffer(demo->device, &buf_info, NULL, &demo->vertices.buf);
    assert(!err);

    vkGetBufferMemoryRequirements(demo->device, demo->vertices.buf, &mem_reqs);
    assert(!err);

    mem_alloc.allocationSize = mem_reqs.size;
    pass = memory_type_from_properties(demo, mem_reqs.memoryTypeBits,
                                       VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT |
                                           VK_MEMORY_PROPERTY_HOST_COHERENT_BIT,
                                       &mem_alloc.memoryTypeIndex);
    assert(pass);

    err = vkAllocateMemory(demo->device, &mem_alloc, NULL, &demo->vertices.mem);
    assert(!err);

    err = vkMapMemory(demo->device, demo->vertices.mem, 0,
                      mem_alloc.allocationSize, 0, &data);
    assert(!err);

    memcpy(data, vb, sizeof(vb));

    vkUnmapMemory(demo->device, demo->vertices.mem);

    err = vkBindBufferMemory(demo->device, demo->vertices.buf,
                             demo->vertices.mem, 0);
    assert(!err);

    demo->vertices.vi.sType =
        VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
    demo->vertices.vi.pNext = NULL;
    demo->vertices.vi.vertexBindingDescriptionCount = 1;
    demo->vertices.vi.pVertexBindingDescriptions = demo->vertices.vi_bindings;
    demo->vertices.vi.vertexAttributeDescriptionCount = 2;
    demo->vertices.vi.pVertexAttributeDescriptions = demo->vertices.vi_attrs;

    demo->vertices.vi_bindings[0].binding = VERTEX_BUFFER_BIND_ID;
    demo->vertices.vi_bindings[0].stride = sizeof(vb[0]);
    demo->vertices.vi_bindings[0].inputRate = VK_VERTEX_INPUT_RATE_VERTEX;

    demo->vertices.vi_attrs[0].binding = VERTEX_BUFFER_BIND_ID;
    demo->vertices.vi_attrs[0].location = 0;
    demo->vertices.vi_attrs[0].format = VK_FORMAT_R32G32B32_SFLOAT;
    demo->vertices.vi_attrs[0].offset = 0;

    demo->vertices.vi_attrs[1].binding = VERTEX_BUFFER_BIND_ID;
    demo->vertices.vi_attrs[1].location = 1;
    demo->vertices.vi_attrs[1].format = VK_FORMAT_R32G32_SFLOAT;
    demo->vertices.vi_attrs[1].offset = sizeof(float) * 3;
}